

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.h
# Opt level: O0

void __thiscall
kj::Lazy<unsigned_int>::
InitImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/mutex-test.c++:197:3)>
::run(InitImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_mutex_test_c__:197:3)>
      *this)

{
  Own<unsigned_int> local_20;
  InitImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_mutex_test_c__:197:3)>
  *local_10;
  InitImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_mutex_test_c__:197:3)>
  *this_local;
  
  local_10 = this;
  NoInfer_<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/mutex-test.c++:197:3)>
  ::Type::operator()(&local_20,(SpaceFor<unsigned_int> *)&this->field_0x10);
  Own<unsigned_int>::operator=(&this->lazy->value,&local_20);
  Own<unsigned_int>::~Own(&local_20);
  return;
}

Assistant:

void run() override {
    lazy.value = func(lazy.space);
  }